

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

bool_t decLuhnVerify(char *dec)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  
  sVar1 = strLen(dec);
  uVar2 = 0;
  while (sVar3 = sVar1, sVar3 != 0) {
    uVar2 = (uVar2 + (long)dec[sVar3 - 1]) - 0x30;
    sVar1 = 0;
    if (sVar3 != 1) {
      uVar2 = uVar2 + *(long *)("pfokTest: %s\n" + (long)dec[sVar3 - 2] * 8 + 7);
      sVar1 = sVar3 - 2;
    }
  }
  return (bool_t)(uVar2 % 10 == 0);
}

Assistant:

bool_t decLuhnVerify(const char* dec)
{
	register word cd = 0;
	size_t i;
	ASSERT(decIsValid(dec));
	for (i = strLen(dec); i--;) 
	{
		cd += dec[i] - '0';
		if (i)
			cd += luhn_table[dec[--i] - '0'];
	}
	cd %= 10;
	return wordEq(cd, 0);
}